

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

int AF_AActor_A_Pain(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  uint uVar1;
  player_t *ppVar2;
  bool bVar3;
  int iVar4;
  FSoundID *sound_id;
  AActor *ent;
  char *pcVar5;
  FString pain_sound;
  FSoundID local_28;
  FSoundID local_24;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00401ae4;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00401ad4:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00401ae4:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_004019a9;
    bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00401ae4;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_00401ad4;
LAB_004019a9:
    ent = (AActor *)0x0;
  }
  ppVar2 = ent->player;
  if ((ppVar2 == (player_t *)0x0) || (ppVar2->morphTics != 0)) {
    local_28.ID = (ent->PainSound).super_FSoundID.ID;
    if (local_28.ID == 0) {
      return 0;
    }
    sound_id = &local_28;
    goto LAB_00401ab1;
  }
  uVar1 = ent->health;
  if ((int)uVar1 < 0x19) {
    pcVar5 = "*pain25";
  }
  else if (uVar1 < 0x32) {
    pcVar5 = "*pain50";
  }
  else {
    pcVar5 = "*pain100";
    if (uVar1 < 0x4b) {
      pcVar5 = "*pain75";
    }
  }
  if ((ppVar2->LastDamageType).Index == 0) {
LAB_00401aa0:
    iVar4 = S_FindSound(pcVar5);
  }
  else {
    FString::FString(&pain_sound,pcVar5);
    FString::operator+=(&pain_sound,'-');
    FString::operator+=(&pain_sound,&ent->player->LastDamageType);
    iVar4 = S_FindSound(pain_sound.Chars);
    if (iVar4 == 0) {
      FString::operator=(&pain_sound,"*pain-");
      FString::operator+=(&pain_sound,&ent->player->LastDamageType);
      iVar4 = S_FindSound(pain_sound.Chars);
    }
    FString::~FString(&pain_sound);
    if (iVar4 == 0) goto LAB_00401aa0;
  }
  sound_id = &local_24;
  local_24.ID = iVar4;
LAB_00401ab1:
  S_Sound(ent,2,sound_id,1.0,1.0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Pain)
{
	PARAM_SELF_PROLOGUE(AActor);

	// [RH] Vary player pain sounds depending on health (ala Quake2)
	if (self->player && self->player->morphTics == 0)
	{
		const char *pain_amount;
		FSoundID sfx_id;

		if (self->health < 25)
			pain_amount = "*pain25";
		else if (self->health < 50)
			pain_amount = "*pain50";
		else if (self->health < 75)
			pain_amount = "*pain75";
		else
			pain_amount = "*pain100";

		// Try for damage-specific sounds first.
		if (self->player->LastDamageType != NAME_None)
		{
			FString pain_sound = pain_amount;
			pain_sound += '-';
			pain_sound += self->player->LastDamageType;
			sfx_id = pain_sound;
			if (sfx_id == 0)
			{
				// Try again without a specific pain amount.
				pain_sound = "*pain-";
				pain_sound += self->player->LastDamageType;
				sfx_id = pain_sound;
			}
		}
		if (sfx_id == 0)
		{
			sfx_id = pain_amount;
		}

		S_Sound (self, CHAN_VOICE, sfx_id, 1, ATTN_NORM);
	}
	else if (self->PainSound)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
	}
	return 0;
}